

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

void HighsHashHelpers::sparse_inverse_combine(u64 *hash,HighsInt index)

{
  u64 uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = modexp_M61(*(ulong *)(&DAT_003d8f20 + (ulong)(index & 0x3f) * 8) & 0x1fffffffffffffff,
                     ((ulong)(long)index >> 6) + 1);
  uVar2 = (*hash - uVar1) + 0x1fffffffffffffff;
  uVar3 = (uVar2 & 0x1fffffffffffffff) + (uVar2 >> 0x3d);
  uVar2 = uVar3 + 0xe000000000000001;
  if (uVar3 < 0x1fffffffffffffff) {
    uVar2 = uVar3;
  }
  *hash = uVar2;
  return;
}

Assistant:

static void sparse_inverse_combine(u64& hash, HighsInt index) {
    // same hash algorithm as sparse_combine(), but for updating a hash value to
    // the state before it was changed with a call to sparse_combine(). This is
    // easily possible as the hash value just uses finite field arithmetic. We
    // can simply add the additive inverse of the previous hash value. This is a
    // very useful routine for symmetry detection. During partition refinement
    // the hashes do not need to be recomputed but can be updated with this
    // procedure.

    u64 a = c[index & 63] & M61();
    u64 degree = (static_cast<u64>(index) >> 6) + 1;
    // add the additive inverse (M61() - hashvalue) instead of the hash value
    // itself
    hash += M61() - modexp_M61(a, degree);
    hash = (hash >> 61) + (hash & M61());
    if (hash >= M61()) hash -= M61();
    assert(hash < M61());
  }